

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_log.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBLogInit(ClientContext *context,TableFunctionInitInput *input)

{
  bool bVar1;
  LogManager *this;
  element_type *peVar2;
  undefined1 local_38 [40];
  
  this = LogManager::Get((ClientContext *)input);
  bVar1 = LogManager::CanScan(this);
  if (bVar1) {
    LogManager::Get((ClientContext *)input);
    LogManager::GetLogStorage((LogManager *)local_38);
    peVar2 = (element_type *)operator_new(0x20);
    local_38._16_8_ = local_38._0_8_;
    local_38._24_8_ = local_38._8_8_;
    local_38._0_8_ = (element_type *)0x0;
    local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    DuckDBLogData::DuckDBLogData
              ((DuckDBLogData *)peVar2,(shared_ptr<duckdb::LogStorage,_true> *)(local_38 + 0x10));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._24_8_);
    }
    (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
    }
  }
  else {
    peVar2 = (element_type *)operator_new(0x20);
    *(undefined ***)&(peVar2->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ =
         &PTR__DuckDBLogData_02452c48;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar2->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8))->_M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (peVar2->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = 0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(peVar2->db).internal + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBLogInit(ClientContext &context, TableFunctionInitInput &input) {
	if (LogManager::Get(context).CanScan()) {
		return make_uniq<DuckDBLogData>(LogManager::Get(context).GetLogStorage());
	}
	return make_uniq<DuckDBLogData>();
}